

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O2

void uiter_setUTF8_63(UCharIterator *iter,char *s,int32_t length)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  UCharIterator *pUVar4;
  UCharIterator *pUVar5;
  
  if (iter != (UCharIterator *)0x0) {
    if (length < -1 || s == (char *)0x0) {
      pUVar4 = &noopIterator;
      for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
        iter->context = pUVar4->context;
        pUVar4 = (UCharIterator *)&pUVar4->length;
        iter = (UCharIterator *)&iter->length;
      }
    }
    else {
      pUVar4 = &utf8Iterator;
      pUVar5 = iter;
      for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
        pUVar5->context = pUVar4->context;
        pUVar4 = (UCharIterator *)&pUVar4->length;
        pUVar5 = (UCharIterator *)&pUVar5->length;
      }
      iter->context = s;
      if (length < 0) {
        sVar2 = strlen(s);
        length = (int32_t)sVar2;
      }
      iter->limit = length;
      iVar1 = -1;
      if (length < 2) {
        iVar1 = length;
      }
      iter->length = iVar1;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setUTF8(UCharIterator *iter, const char *s, int32_t length) {
    if(iter!=0) {
        if(s!=0 && length>=-1) {
            *iter=utf8Iterator;
            iter->context=s;
            if(length>=0) {
                iter->limit=length;
            } else {
                iter->limit=(int32_t)uprv_strlen(s);
            }
            iter->length= iter->limit<=1 ? iter->limit : -1;
        } else {
            *iter=noopIterator;
        }
    }
}